

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

light_pcapng light_read_from_memory(uint32_t *memory,size_t size)

{
  _light_pcapng *head;
  size_t in_stack_000000e8;
  uint32_t *in_stack_000000f0;
  _light_pcapng **in_stack_000000f8;
  
  __parse_mem_copy(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  return (light_pcapng)0x0;
}

Assistant:

light_pcapng light_read_from_memory(const uint32_t *memory, size_t size)
{
	struct _light_pcapng *head = NULL;
	__parse_mem_copy(&head, memory, size);
	return head;
}